

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

int StringHold(Situation *s)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  int iVar5;
  bool bVar6;
  UINT8 *pUVar7;
  bool bVar8;
  uint uVar9;
  int *piVar10;
  uint uVar11;
  uint player;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  long lVar18;
  uint to;
  ulong uVar19;
  int local_a4;
  int local_50;
  int local_4c;
  ulong local_48;
  ulong local_40;
  UINT8 *local_38;
  ulong uVar12;
  ulong uVar17;
  
  local_38 = s->current_pieces + 0x27;
  piVar10 = &local_4c;
  bVar6 = true;
  lVar13 = 0;
  do {
    pUVar7 = local_38;
    *piVar10 = 0;
    local_40 = lVar13 * 0x10 + 0x10;
    lVar4 = lVar13 * -0x10;
    uVar14 = (int)lVar4 + 0x20;
    player = (uint)lVar13 ^ 1;
    uVar15 = 7;
    local_a4 = 0;
    do {
      bVar1 = s->current_pieces[uVar15 | local_40];
      if (bVar1 != 0) {
        bVar2 = *(byte *)((long)s + lVar4 + 0x124);
        uVar11 = bVar1 & 0xf;
        uVar12 = (ulong)uVar11;
        uVar16 = (uint)(bVar1 >> 4);
        uVar17 = (ulong)uVar16;
        if (bVar2 != 0) {
          uVar9 = bVar2 & 0xf;
          if (uVar11 == uVar9) {
            if (bVar2 >> 4 ==
                ROOK_CANNON_CAN_GET_COL[uVar17 - 3][s->bit_col[uVar12]].cannon_capture
                [bVar2 <= bVar1]) {
              uVar19 = (ulong)((uint)ROOK_CANNON_CAN_GET_COL[uVar17 - 3][s->bit_col[uVar12]].
                                     rook_capture[bVar2 <= bVar1] << 4 | uVar11);
              bVar3 = s->current_board[uVar19];
joined_r0x0010ccfa:
              if (((uVar14 & bVar3) != 0) && ((0x66006600000U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) {
                bVar8 = IfProtected(player,(int)uVar19,s,(uint)bVar2);
                if (!bVar8) {
                  local_a4 = local_a4 + ""[(int)((bVar2 | 0x100) - (int)uVar19)];
                  *piVar10 = local_a4;
                }
              }
            }
          }
          else if (uVar16 == bVar2 >> 4) {
            if (uVar9 == ROOK_CANNON_CAN_GET_ROW[uVar12 - 3][s->bit_col[uVar17]].cannon_capture
                         [bVar2 <= bVar1]) {
              uVar19 = (ulong)ROOK_CANNON_CAN_GET_ROW[uVar12 - 3][s->bit_col[uVar17]].rook_capture
                              [bVar2 <= bVar1] + (ulong)(bVar1 & 0xfffffff0);
              bVar3 = s->current_board[uVar19];
              goto joined_r0x0010ccfa;
            }
          }
        }
        lVar18 = 0;
        local_48 = uVar15;
        do {
          bVar2 = pUVar7[lVar18 + lVar13 * -0x10];
          uVar9 = (uint)bVar2;
          if (bVar2 != 0) {
            if (uVar11 == (uVar9 & 0xf)) {
              if (bVar2 >> 4 ==
                  ROOK_CANNON_CAN_GET_COL[(int)(uVar16 - 3)][s->bit_col[uVar12]].cannon_capture
                  [bVar2 <= bVar1]) {
                to = (uint)ROOK_CANNON_CAN_GET_COL[(int)(uVar16 - 3)][s->bit_col[uVar12]].
                           rook_capture[bVar2 <= bVar1] << 4 | uVar11;
                uVar19 = (ulong)to;
                if ((((uVar14 & s->current_board[uVar19]) != 0) &&
                    ((0x66006600000U >> ((ulong)s->current_board[uVar19] & 0x3f) & 1) != 0)) &&
                   (bVar8 = IfProtected(player,uVar9,s,0), uVar15 = local_48, !bVar8)) {
                  bVar8 = IfProtected(player,to,s,uVar9);
                  uVar15 = local_48;
joined_r0x0010cea9:
                  if (!bVar8) {
                    local_a4 = local_a4 + ""[(int)((uVar9 | 0x100) - (int)uVar19)];
                    *piVar10 = local_a4;
                  }
                }
              }
            }
            else if (uVar16 == bVar2 >> 4) {
              if ((uVar9 & 0xf) ==
                  (uint)ROOK_CANNON_CAN_GET_ROW[(int)(uVar11 - 3)][s->bit_col[uVar17]].
                        cannon_capture[bVar2 <= bVar1]) {
                uVar19 = (ulong)ROOK_CANNON_CAN_GET_ROW[(int)(uVar11 - 3)][s->bit_col[uVar17]].
                                rook_capture[bVar2 <= bVar1] + (ulong)(bVar1 & 0xfffffff0);
                if ((((uVar14 & s->current_board[uVar19]) != 0) &&
                    ((0x66006600000U >> ((ulong)s->current_board[uVar19] & 0x3f) & 1) != 0)) &&
                   (bVar8 = IfProtected(player,(uint)bVar2,s,0), !bVar8)) {
                  bVar8 = IfProtected(player,(int)uVar19,s,(uint)bVar2);
                  goto joined_r0x0010cea9;
                }
              }
            }
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 != 2);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != 9);
    uVar15 = 9;
    do {
      bVar1 = s->current_pieces[uVar15 | local_40];
      if (bVar1 != 0) {
        bVar2 = *(byte *)((long)s + lVar4 + 0x124);
        uVar16 = bVar1 & 0xf;
        uVar17 = (ulong)uVar16;
        uVar11 = (uint)(bVar1 >> 4);
        uVar12 = (ulong)uVar11;
        if (bVar2 != 0) {
          uVar9 = bVar2 & 0xf;
          if (uVar16 == uVar9) {
            if (bVar2 >> 4 ==
                ROOK_CANNON_CAN_GET_COL[uVar12 - 3][s->bit_col[uVar17]].supercannon_capture
                [bVar2 <= bVar1]) {
              uVar19 = (ulong)((uint)ROOK_CANNON_CAN_GET_COL[uVar12 - 3][s->bit_col[uVar17]].
                                     cannon_capture[bVar2 <= bVar1] << 4 | uVar16);
              bVar3 = s->current_board[uVar19];
joined_r0x0010d099:
              if (((uVar14 & bVar3) != 0) && ((0x66006600000U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) {
                bVar8 = IfProtected(player,(int)uVar19,s,(uint)bVar2);
                if (!bVar8) {
                  local_a4 = local_a4 + ""[(int)((bVar2 | 0x100) - (int)uVar19)];
                  *piVar10 = local_a4;
                }
              }
            }
          }
          else if (uVar11 == bVar2 >> 4) {
            if (uVar9 == ROOK_CANNON_CAN_GET_ROW[uVar17 - 3][s->bit_col[uVar12]].supercannon_capture
                         [bVar2 <= bVar1]) {
              uVar19 = (ulong)ROOK_CANNON_CAN_GET_ROW[uVar17 - 3][s->bit_col[uVar12]].cannon_capture
                              [bVar2 <= bVar1] + (ulong)(bVar1 & 0xfffffff0);
              bVar3 = s->current_board[uVar19];
              goto joined_r0x0010d099;
            }
          }
        }
        lVar18 = 0;
        do {
          bVar2 = pUVar7[lVar18 + lVar13 * -0x10];
          if (bVar2 != 0) {
            uVar9 = bVar2 & 0xf;
            if (uVar16 == uVar9) {
              if (bVar2 >> 4 ==
                  ROOK_CANNON_CAN_GET_COL[(int)(uVar11 - 3)][s->bit_col[uVar17]].supercannon_capture
                  [bVar2 <= bVar1]) {
                uVar19 = (ulong)((uint)ROOK_CANNON_CAN_GET_COL[(int)(uVar11 - 3)]
                                       [s->bit_col[uVar17]].cannon_capture[bVar2 <= bVar1] << 4 |
                                uVar16);
                bVar3 = s->current_board[uVar19];
joined_r0x0010d1f1:
                if (((uVar14 & bVar3) != 0) && ((0x66006600000U >> ((ulong)bVar3 & 0x3f) & 1) != 0))
                {
                  bVar8 = IfProtected(player,(int)uVar19,s,(uint)bVar2);
                  if (!bVar8) {
                    local_a4 = local_a4 + ""[(int)((bVar2 | 0x100) - (int)uVar19)];
                    *piVar10 = local_a4;
                  }
                }
              }
            }
            else if (uVar11 == bVar2 >> 4) {
              if (uVar9 == ROOK_CANNON_CAN_GET_ROW[(int)(uVar16 - 3)][s->bit_col[uVar12]].
                           supercannon_capture[bVar2 <= bVar1]) {
                uVar19 = (ulong)ROOK_CANNON_CAN_GET_ROW[(int)(uVar16 - 3)][s->bit_col[uVar12]].
                                cannon_capture[bVar2 <= bVar1] + (ulong)(bVar1 & 0xfffffff0);
                bVar3 = s->current_board[uVar19];
                goto joined_r0x0010d1f1;
              }
            }
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 != 2);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != 0xb);
    lVar13 = 1;
    piVar10 = &local_50;
    bVar8 = !bVar6;
    bVar6 = false;
    if (bVar8) {
      iVar5 = -(local_4c - local_50);
      if (s->current_player == 0) {
        iVar5 = local_4c - local_50;
      }
      return iVar5;
    }
  } while( true );
}

Assistant:

int StringHold(Situation &s)
{
    int dir, pos_from, pos_to, pos_str;
    int x, y, side_tag, opp_side_tag;
    int string_value[2];

    for (int r = 0; r < 2; r++)
    {
        string_value[r] = 0;
        side_tag = 16 + (r << 4);
        opp_side_tag = 32 - (r << 4);
        //考察用車牵制的情况
        for (int i = 7; i <= 8; i++)
        {
            pos_from = s.current_pieces[side_tag + i];
            if (pos_from)
            {
                //考察牵制目标是帅(将)的情况
                pos_to = s.current_pieces[opp_side_tag];
                if (pos_to)
                {
                    x = GetCol(pos_from);
                    y = GetRow(pos_from);
                    if (x == GetCol(pos_to)) //纵向牵制
                    {
                        dir = (pos_from < pos_to ? 0 : 1);
                        // 如果车用炮的吃法(炮用超级炮的着法)能吃到目标子"sqDst"，牵制就成立了，下同
                        int capture_row = ROOK_CANNON_CAN_GET_COL[y - 3][s.bit_col[x]].cannon_capture[dir];
                        if (capture_row == GetRow(pos_to))
                        {
                            pos_str = x + (ROOK_CANNON_CAN_GET_COL[y - 3][s.bit_col[x]].rook_capture[dir] << 4); //计算被牵制的子位置，是车(炮)本身能吃到的棋子
                            if (s.current_board[pos_str] & opp_side_tag)                                         //被牵制子必须是对方的子
                            {
                                if (VALUABLE_STRING_PIECES[s.current_board[pos_str]] > 0 && !IfProtected(1 - r, pos_str, s, pos_to)) // 如果被牵制子是有价值的，而且被牵制子没有保护(被目标子保护不算)，那么牵制是有价值的
                                {
                                    string_value[r] += STRING_VALUE_TAB[pos_to - pos_str + 256];
                                }
                            }
                        }
                    }
                    else if (y == GetRow(pos_to)) //横向牵制
                    {
                        dir = (pos_from < pos_to ? 0 : 1);
                        int capture_col = ROOK_CANNON_CAN_GET_ROW[x - 3][s.bit_col[y]].cannon_capture[dir];
                        if (capture_col == GetCol(pos_to))
                        {
                            pos_str = (y << 4) + ROOK_CANNON_CAN_GET_ROW[x - 3][s.bit_col[y]].rook_capture[dir];
                            if (s.current_board[pos_str] & opp_side_tag)
                            {
                                if (VALUABLE_STRING_PIECES[s.current_board[pos_str]] > 0 && !IfProtected(1 - r, pos_str, s, pos_to))
                                {
                                    string_value[r] += STRING_VALUE_TAB[pos_to - pos_str + 256];
                                }
                            }
                        }
                    }
                }

                // 考查牵制目标是车的情况
                for (int i = 7; i <= 8; i++)
                {
                    pos_to = s.current_pieces[opp_side_tag + i];
                    if (pos_to)
                    {
                        x = GetCol(pos_from);
                        y = GetRow(pos_from);
                        if (x == GetCol(pos_to))
                        {
                            dir = (pos_from < pos_to ? 0 : 1);
                            int capture_row = ROOK_CANNON_CAN_GET_COL[y - 3][s.bit_col[x]].cannon_capture[dir];
                            if (capture_row == GetRow(pos_to))
                            {
                                pos_str = x + (ROOK_CANNON_CAN_GET_COL[y - 3][s.bit_col[x]].rook_capture[dir] << 4);
                                if (s.current_board[pos_str] & opp_side_tag)
                                {
                                    if (VALUABLE_STRING_PIECES[s.current_board[pos_str]] > 0 && !IfProtected(1 - r, pos_to, s) && !IfProtected(1 - r, pos_str, s, pos_to))
                                    {
                                        string_value[r] += STRING_VALUE_TAB[pos_to - pos_str + 256];
                                    }
                                }
                            }
                        }
                        else if (y == GetRow(pos_to))
                        {
                            dir = (pos_from < pos_to ? 0 : 1);
                            int capture_col = ROOK_CANNON_CAN_GET_ROW[x - 3][s.bit_col[y]].cannon_capture[dir];
                            if (capture_col == GetCol(pos_to))
                            {
                                pos_str = (y << 4) + ROOK_CANNON_CAN_GET_ROW[x - 3][s.bit_col[y]].rook_capture[dir];
                                if (s.current_board[pos_str] & opp_side_tag)
                                {
                                    if (VALUABLE_STRING_PIECES[s.current_board[pos_str]] > 0 && !IfProtected(1 - r, pos_to, s) && !IfProtected(1 - r, pos_str, s, pos_to))
                                    {
                                        string_value[r] += STRING_VALUE_TAB[pos_to - pos_str + 256];
                                    }
                                }
                            }
                        }
                    }
                }
            }
        }

        // 考查用炮来牵制的情况
        for (int i = 9; i <= 10; i++)
        {
            pos_from = s.current_pieces[side_tag + i];
            if (pos_from)
            {
                //考察牵制目标是帅(将)的情况
                pos_to = s.current_pieces[opp_side_tag];
                if (pos_to)
                {
                    x = GetCol(pos_from);
                    y = GetRow(pos_from);
                    if (x == GetCol(pos_to))
                    {
                        dir = (pos_from < pos_to ? 0 : 1);
                        int capture_row = ROOK_CANNON_CAN_GET_COL[y - 3][s.bit_col[x]].supercannon_capture[dir];
                        if (capture_row == GetRow(pos_to))
                        {
                            pos_str = x + (ROOK_CANNON_CAN_GET_COL[y - 3][s.bit_col[x]].cannon_capture[dir] << 4);
                            if (s.current_board[pos_str] & opp_side_tag)
                            {
                                if (VALUABLE_STRING_PIECES[s.current_board[pos_str]] > 0 && !IfProtected(1 - r, pos_str, s, pos_to))
                                {
                                    string_value[r] += STRING_VALUE_TAB[pos_to - pos_str + 256];
                                }
                            }
                        }
                    }
                    else if (y == GetRow(pos_to))
                    {
                        dir = (pos_from < pos_to ? 0 : 1);
                        int capture_col = ROOK_CANNON_CAN_GET_ROW[x - 3][s.bit_col[y]].supercannon_capture[dir];
                        if (capture_col == GetCol(pos_to))
                        {
                            pos_str = (y << 4) + ROOK_CANNON_CAN_GET_ROW[x - 3][s.bit_col[y]].cannon_capture[dir];
                            if (s.current_board[pos_str] & opp_side_tag)
                            {
                                if (VALUABLE_STRING_PIECES[s.current_board[pos_str]] > 0 && !IfProtected(1 - r, pos_str, s, pos_to))
                                {
                                    string_value[r] += STRING_VALUE_TAB[pos_to - pos_str + 256];
                                }
                            }
                        }
                    }
                }

                // 考查牵制目标是车的情况
                for (int i = 7; i <= 8; i++)
                {
                    pos_to = s.current_pieces[opp_side_tag + i];
                    if (pos_to)
                    {
                        x = GetCol(pos_from);
                        y = GetRow(pos_from);
                        if (x == GetCol(pos_to))
                        {
                            dir = (pos_from < pos_to ? 0 : 1);
                            int capture_row = ROOK_CANNON_CAN_GET_COL[y - 3][s.bit_col[x]].supercannon_capture[dir];
                            if (capture_row == GetRow(pos_to))
                            {
                                pos_str = x + (ROOK_CANNON_CAN_GET_COL[y - 3][s.bit_col[x]].cannon_capture[dir] << 4);
                                if (s.current_board[pos_str] & opp_side_tag)
                                {
                                    if (VALUABLE_STRING_PIECES[s.current_board[pos_str]] > 0 && !IfProtected(1 - r, pos_str, s, pos_to))
                                    {
                                        string_value[r] += STRING_VALUE_TAB[pos_to - pos_str + 256];
                                    }
                                }
                            }
                        }
                        else if (y == GetRow(pos_to))
                        {
                            dir = (pos_from < pos_to ? 0 : 1);
                            int capture_col = ROOK_CANNON_CAN_GET_ROW[x - 3][s.bit_col[y]].supercannon_capture[dir];
                            if (capture_col == GetCol(pos_to))
                            {
                                pos_str = (y << 4) + ROOK_CANNON_CAN_GET_ROW[x - 3][s.bit_col[y]].cannon_capture[dir];
                                if (s.current_board[pos_str] & opp_side_tag)
                                {
                                    if (VALUABLE_STRING_PIECES[s.current_board[pos_str]] > 0 && !IfProtected(1 - r, pos_str, s, pos_to))
                                    {
                                        string_value[r] += STRING_VALUE_TAB[pos_to - pos_str + 256];
                                    }
                                }
                            }
                        }
                    }
                }
            }
        }
    }

    return SideValue(s.current_player, string_value[RED] - string_value[BLACK]);
}